

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlDocPtr xmlCtxtGetDocument(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlDocPtr local_20;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    if ((ctxt->wellFormed == 0) &&
       (((ctxt->recovery == 0 && (ctxt->html == 0)) ||
        (iVar1 = xmlCtxtIsCatastrophicError(ctxt), iVar1 != 0)))) {
      if (ctxt->errNo == 0) {
        xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"unknown error");
      }
      local_20 = (xmlDocPtr)0x0;
      xmlFreeDoc(ctxt->myDoc);
    }
    else {
      local_20 = ctxt->myDoc;
    }
    ctxt->myDoc = (xmlDocPtr)0x0;
    return local_20;
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtGetDocument(xmlParserCtxtPtr ctxt) {
    xmlDocPtr doc;

    if (ctxt == NULL)
        return(NULL);

    if ((ctxt->wellFormed) ||
        (((ctxt->recovery) || (ctxt->html)) &&
         (!xmlCtxtIsCatastrophicError(ctxt)))) {
        doc = ctxt->myDoc;
    } else {
        if (ctxt->errNo == XML_ERR_OK)
            xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "unknown error");
        doc = NULL;
        xmlFreeDoc(ctxt->myDoc);
    }
    ctxt->myDoc = NULL;

    return(doc);
}